

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

jsgf_t * jsgf_grammar_new(jsgf_t *parent)

{
  jsgf_t *pjVar1;
  hash_table_t *phVar2;
  
  pjVar1 = (jsgf_t *)
           __ckd_calloc__(1,0x58,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x58);
  if (parent == (jsgf_t *)0x0) {
    phVar2 = hash_table_new(0x40,0);
    pjVar1->rules = phVar2;
    phVar2 = hash_table_new(0x10,0);
  }
  else {
    pjVar1->rules = parent->rules;
    phVar2 = parent->imports;
    pjVar1->searchpath = parent->searchpath;
    pjVar1->parent = parent;
  }
  pjVar1->imports = phVar2;
  return pjVar1;
}

Assistant:

jsgf_t *
jsgf_grammar_new(jsgf_t * parent)
{
    jsgf_t *grammar;

    grammar = ckd_calloc(1, sizeof(*grammar));
    /* If this is an imported/subgrammar, then we will share a global
     * namespace with the parent grammar. */
    if (parent) {
        grammar->rules = parent->rules;
        grammar->imports = parent->imports;
        grammar->searchpath = parent->searchpath;
        grammar->parent = parent;
    }
    else {
        grammar->rules = hash_table_new(64, 0);
        grammar->imports = hash_table_new(16, 0);
    }

    return grammar;
}